

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalNinjaGenerator::ComputeTargetObjectDirectory
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *gt)

{
  char *pcVar1;
  string local_70 [48];
  string local_40 [8];
  string dir;
  cmTarget *target;
  cmGeneratorTarget *gt_local;
  cmGlobalNinjaGenerator *this_local;
  
  dir.field_2._8_8_ = gt->Target;
  std::__cxx11::string::string(local_40);
  pcVar1 = cmMakefile::GetCurrentBinaryDirectory(gt->Makefile);
  std::__cxx11::string::operator+=(local_40,pcVar1);
  std::__cxx11::string::operator+=(local_40,"/");
  (*gt->LocalGenerator->_vptr_cmLocalGenerator[0xc])(local_70,gt->LocalGenerator,dir.field_2._8_8_);
  std::__cxx11::string::operator+=(local_40,local_70);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::operator+=(local_40,"/");
  std::__cxx11::string::operator=((string *)&gt->ObjectDirectory,local_40);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmGlobalNinjaGenerator
::ComputeTargetObjectDirectory(cmGeneratorTarget* gt) const
{
  cmTarget* target = gt->Target;

  // Compute full path to object file directory for this target.
  std::string dir;
  dir += gt->Makefile->GetCurrentBinaryDirectory();
  dir += "/";
  dir += gt->LocalGenerator->GetTargetDirectory(*target);
  dir += "/";
  gt->ObjectDirectory = dir;
}